

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_flac_init_memory(void *pData,size_t dataSize,ma_decoding_backend_config *pConfig,
                             ma_allocation_callbacks *pAllocationCallbacks,ma_flac *pFlac)

{
  ma_result mVar1;
  ma_dr_flac *pmVar2;
  
  mVar1 = ma_flac_init_internal(pConfig,pFlac);
  if (mVar1 == MA_SUCCESS) {
    pmVar2 = ma_dr_flac_open_memory(pData,dataSize,pAllocationCallbacks);
    pFlac->dr = pmVar2;
    mVar1 = MA_INVALID_FILE;
    if (pmVar2 != (ma_dr_flac *)0x0) {
      mVar1 = MA_SUCCESS;
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_flac_init_memory(const void* pData, size_t dataSize, const ma_decoding_backend_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_flac* pFlac)
{
    ma_result result;

    result = ma_flac_init_internal(pConfig, pFlac);
    if (result != MA_SUCCESS) {
        return result;
    }

    #if !defined(MA_NO_FLAC)
    {
        pFlac->dr = ma_dr_flac_open_memory(pData, dataSize, pAllocationCallbacks);
        if (pFlac->dr == NULL) {
            return MA_INVALID_FILE;
        }

        return MA_SUCCESS;
    }
    #else
    {
        /* flac is disabled. */
        (void)pData;
        (void)dataSize;
        (void)pAllocationCallbacks;
        return MA_NOT_IMPLEMENTED;
    }
    #endif
}